

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O3

int run_test_udp_alloc_cb_fail(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_udp_t *loop;
  uv_loop_t *req_00;
  sockaddr *addr_00;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  uv_udp_t *puVar3;
  code *pcVar4;
  uv_udp_t *puVar5;
  char *pcVar6;
  uv_loop_t *puVar7;
  int in_R8D;
  sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t uStack_198;
  uv_loop_t *puStack_188;
  undefined1 auStack_168 [352];
  
  puVar5 = (uv_udp_t *)auStack_168;
  pcVar6 = "0.0.0.0";
  puVar3 = (uv_udp_t *)0x23a3;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)auStack_168);
  if (iVar1 == 0) {
    loop = (uv_udp_t *)uv_default_loop();
    puVar3 = &server;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&server);
    if (iVar1 != 0) goto LAB_00176030;
    loop = &server;
    iVar1 = uv_udp_bind(&server,(sockaddr *)auStack_168,0);
    if (iVar1 != 0) goto LAB_00176035;
    loop = &server;
    pcVar4 = sv_alloc_cb;
    iVar1 = uv_udp_recv_start(&server,sv_alloc_cb,sv_recv_cb);
    puVar5 = (uv_udp_t *)pcVar4;
    if (iVar1 != 0) goto LAB_0017603a;
    loop = (uv_udp_t *)0x1a4b3a;
    puVar5 = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)auStack_168);
    if (iVar1 != 0) goto LAB_0017603f;
    loop = (uv_udp_t *)uv_default_loop();
    puVar5 = &client;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&client);
    if (iVar1 != 0) goto LAB_00176044;
    auStack_168._16_16_ = (undefined1  [16])uv_buf_init("PING",4);
    puVar5 = &client;
    loop = (uv_udp_t *)(auStack_168 + 0x20);
    in_R8D = (int)auStack_168;
    iVar1 = uv_udp_send((uv_udp_send_t *)loop,&client,(uv_buf_t *)(auStack_168 + 0x10),1,
                        (sockaddr *)auStack_168,cl_send_cb);
    if (iVar1 != 0) goto LAB_00176049;
    if (close_cb_called != 0) goto LAB_0017604e;
    if (cl_send_cb_called != 0) goto LAB_00176053;
    if (cl_recv_cb_called != 0) goto LAB_00176058;
    if (sv_send_cb_called != 0) goto LAB_0017605d;
    if (sv_recv_cb_called != 0) goto LAB_00176062;
    loop = (uv_udp_t *)uv_default_loop();
    puVar5 = (uv_udp_t *)0x0;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (cl_send_cb_called != 1) goto LAB_00176067;
    if (cl_recv_cb_called != 1) goto LAB_0017606c;
    if (sv_send_cb_called != 1) goto LAB_00176071;
    if (sv_recv_cb_called != 1) goto LAB_00176076;
    if (close_cb_called != 2) goto LAB_0017607b;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puVar5 = (uv_udp_t *)0x0;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    loop = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_udp_alloc_cb_fail_cold_1();
    loop = (uv_udp_t *)pcVar6;
LAB_00176030:
    puVar5 = puVar3;
    run_test_udp_alloc_cb_fail_cold_2();
LAB_00176035:
    run_test_udp_alloc_cb_fail_cold_3();
LAB_0017603a:
    run_test_udp_alloc_cb_fail_cold_4();
LAB_0017603f:
    run_test_udp_alloc_cb_fail_cold_5();
LAB_00176044:
    run_test_udp_alloc_cb_fail_cold_6();
LAB_00176049:
    run_test_udp_alloc_cb_fail_cold_7();
LAB_0017604e:
    run_test_udp_alloc_cb_fail_cold_8();
LAB_00176053:
    run_test_udp_alloc_cb_fail_cold_9();
LAB_00176058:
    run_test_udp_alloc_cb_fail_cold_10();
LAB_0017605d:
    run_test_udp_alloc_cb_fail_cold_11();
LAB_00176062:
    run_test_udp_alloc_cb_fail_cold_12();
LAB_00176067:
    run_test_udp_alloc_cb_fail_cold_13();
LAB_0017606c:
    run_test_udp_alloc_cb_fail_cold_14();
LAB_00176071:
    run_test_udp_alloc_cb_fail_cold_15();
LAB_00176076:
    run_test_udp_alloc_cb_fail_cold_16();
LAB_0017607b:
    run_test_udp_alloc_cb_fail_cold_17();
  }
  run_test_udp_alloc_cb_fail_cold_18();
  addr_00 = (sockaddr *)CONCAT71(0x51fd,loop == &client || loop == &server);
  if (loop == &client || loop == &server) {
    *extraout_RDX = sv_alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x51fe10;
  }
  sv_alloc_cb_cold_1();
  puStack_188 = unaff_RBX;
  if ((long)puVar5 < 0) {
    sv_recv_cb_cold_10();
    puVar7 = (uv_loop_t *)loop;
LAB_001761a1:
    sv_recv_cb_cold_1();
LAB_001761a6:
    sv_recv_cb_cold_2();
LAB_001761ab:
    sv_recv_cb_cold_8();
LAB_001761b0:
    sv_recv_cb_cold_3();
LAB_001761b5:
    sv_recv_cb_cold_4();
LAB_001761ba:
    sv_recv_cb_cold_5();
LAB_001761bf:
    req_00 = puVar7;
    loop = puVar5;
    sv_recv_cb_cold_7();
LAB_001761c4:
    sv_recv_cb_cold_6();
    puVar5 = loop;
    loop = (uv_udp_t *)req_00;
  }
  else {
    if ((uv_loop_t *)puVar5 != (uv_loop_t *)0x0) {
      puVar7 = (uv_loop_t *)loop;
      if (loop != &client && loop != &server) goto LAB_001761a1;
      if (in_R8D != 0) goto LAB_001761a6;
      if (addr_00 == (sockaddr *)0x0) goto LAB_001761ab;
      if ((uv_loop_t *)puVar5 != (uv_loop_t *)0x4) goto LAB_001761b0;
      if (*(int *)*extraout_RDX_00 != 0x474e4950) goto LAB_001761b5;
      iVar1 = uv_udp_recv_stop(loop);
      if (iVar1 != 0) goto LAB_001761ba;
      puVar7 = (uv_loop_t *)0x140;
      req_00 = (uv_loop_t *)malloc(0x140);
      if (req_00 == (uv_loop_t *)0x0) goto LAB_001761bf;
      uStack_198 = uv_buf_init("PONG",4);
      iVar1 = uv_udp_send((uv_udp_send_t *)req_00,loop,&uStack_198,1,addr_00,sv_send_cb);
      if (iVar1 == 0) {
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return 0;
      }
      goto LAB_001761c4;
    }
    if (addr_00 == (sockaddr *)0x0) {
      return extraout_EAX;
    }
  }
  iVar1 = (int)puVar5;
  sv_recv_cb_cold_9();
  if ((uv_loop_t *)loop == (uv_loop_t *)0x0) {
    cl_send_cb_cold_4();
LAB_0017621e:
    cl_send_cb_cold_1();
LAB_00176223:
    cl_send_cb_cold_2();
  }
  else {
    if (iVar1 != 0) goto LAB_0017621e;
    loop = *(uv_udp_t **)&((uv_loop_t *)loop)->backend_fd;
    if (loop != &client && loop != &server) goto LAB_00176223;
    iVar1 = 0x1762c2;
    iVar2 = uv_udp_recv_start(loop,cl_alloc_cb,cl_recv_cb);
    if (iVar2 == 0) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  cl_send_cb_cold_3();
  if ((uv_loop_t *)loop == (uv_loop_t *)0x0) {
    sv_send_cb_cold_3();
    puVar7 = (uv_loop_t *)loop;
  }
  else {
    puVar7 = (uv_loop_t *)loop;
    if (iVar1 == 0) {
      puVar7 = *(uv_loop_t **)&((uv_loop_t *)loop)->backend_fd;
      if (puVar7 == (uv_loop_t *)&client || puVar7 == (uv_loop_t *)&server) {
        uv_close((uv_handle_t *)puVar7,close_cb);
        free(loop);
        sv_send_cb_called = sv_send_cb_called + 1;
        return extraout_EAX_01;
      }
      goto LAB_00176282;
    }
  }
  sv_send_cb_cold_1();
LAB_00176282:
  sv_send_cb_cold_2();
  if (puVar7 == (uv_loop_t *)&client || puVar7 == (uv_loop_t *)&server) {
    iVar1 = uv_is_closing((uv_handle_t *)puVar7);
    if (iVar1 == 1) {
      close_cb_called = close_cb_called + 1;
      return extraout_EAX_02;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(udp_alloc_cb_fail) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, sv_alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_send_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);
  ASSERT(sv_recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_send_cb_called == 1);
  ASSERT(cl_recv_cb_called == 1);
  ASSERT(sv_send_cb_called == 1);
  ASSERT(sv_recv_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}